

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O2

bool units::detail::base_access<1>::minus_overflows<units::detail::unit_data>
               (unit_data *a,unit_data *b)

{
  int iVar1;
  
  iVar1 = ((int)*b << 0x18) >> 0x1c;
  if (iVar1 < 0) {
    return iVar1 + 7 < (int)*(char *)a >> 4;
  }
  if ((uint)((int)*b << 0x18) < 0x10000000) {
    return false;
  }
  return (int)*(char *)a >> 4 < iVar1 + -8;
}

Assistant:

constexpr int second() const { return second_; }